

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChException.h
# Opt level: O2

void __thiscall chrono::ChException::ChException(ChException *this,string *swhat)

{
  *(undefined ***)this = &PTR__ChException_00112930;
  std::__cxx11::string::string((string *)&this->m_swhat,(string *)swhat);
  return;
}

Assistant:

ChException(std::string swhat) : m_swhat(swhat){}